

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void __thiscall LowererMD::LowerTypeof(LowererMD *this,Instr *typeOfInstr)

{
  Func *func;
  Opnd *this_00;
  RegOpnd *baseOpnd;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  BYTE scale;
  int iVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  LabelInstr *target;
  LabelInstr *labelTarget;
  LabelInstr *target_00;
  RegOpnd *baseOpnd_00;
  undefined4 extraout_var;
  AddrOpnd *src;
  RegOpnd *indexOpnd;
  IntConstOpnd *pIVar7;
  RegOpnd *baseOpnd_01;
  IndirOpnd *pIVar8;
  RegOpnd *pRVar9;
  Instr *assignInstr;
  
  func = typeOfInstr->m_func;
  this_00 = typeOfInstr->m_dst;
  baseOpnd = (RegOpnd *)typeOfInstr->m_src1;
  OVar2 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar2 == OpndKindReg) {
    OVar2 = IR::Opnd::GetKind(this_00);
    if (OVar2 != OpndKindReg) goto LAB_0066c634;
  }
  else {
LAB_0066c634:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x2221,"(src1->IsRegOpnd() && dst->IsRegOpnd())",
                       "src1->IsRegOpnd() && dst->IsRegOpnd()");
    if (!bVar3) goto LAB_0066ca34;
    *puVar6 = 0;
  }
  target = IR::LabelInstr::New(Label,func,true);
  labelTarget = IR::LabelInstr::New(Label,func,false);
  target_00 = IR::LabelInstr::New(Label,func,false);
  baseOpnd_00 = IR::RegOpnd::New(TyUint64,func);
  iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x16])();
  src = IR::AddrOpnd::New((Var)(CONCAT44(extraout_var,iVar4) + 0xa68),AddrOpndKindConstantAddress,
                          this->m_func,false,(Var)0x0);
  Lowerer::InsertMove(&baseOpnd_00->super_Opnd,&src->super_Opnd,typeOfInstr,true);
  GenerateObjectTest(this,(Opnd *)baseOpnd,typeOfInstr,labelTarget,false);
  indexOpnd = IR::RegOpnd::New(TyUint32,func);
  pIVar7 = IR::IntConstOpnd::New(0x1c,TyUint32,func,false);
  Lowerer::InsertMove(&indexOpnd->super_Opnd,&pIVar7->super_Opnd,typeOfInstr,true);
  baseOpnd_01 = IR::RegOpnd::New(TyInt64,func);
  OVar2 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_0066ca34:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pIVar8 = IR::IndirOpnd::New(baseOpnd,8,TyInt64,func,false);
  Lowerer::InsertMove(&baseOpnd_01->super_Opnd,&pIVar8->super_Opnd,typeOfInstr,true);
  pRVar9 = IR::RegOpnd::New(TyUint32,func);
  uVar5 = Js::Type::GetOffsetOfTypeId();
  pIVar8 = IR::IndirOpnd::New(baseOpnd_01,uVar5,TyInt32,func,false);
  Lowerer::InsertMove(&pRVar9->super_Opnd,&pIVar8->super_Opnd,typeOfInstr,true);
  pIVar7 = IR::IntConstOpnd::New(0x58,TyUint32,func,false);
  Lowerer::InsertCompare(&pRVar9->super_Opnd,&pIVar7->super_Opnd,typeOfInstr);
  InsertCmovCC(CMOVB,&indexOpnd->super_Opnd,&pRVar9->super_Opnd,typeOfInstr,false);
  pRVar9 = IR::RegOpnd::New(TyUint32,func);
  pIVar7 = IR::IntConstOpnd::New(0,TyUint32,func,false);
  Lowerer::InsertMove(&pRVar9->super_Opnd,&pIVar7->super_Opnd,typeOfInstr,true);
  uVar5 = Js::Type::GetOffsetOfFlags();
  pIVar8 = IR::IndirOpnd::New(baseOpnd_01,uVar5,TyInt32,this->m_func,false);
  pIVar7 = IR::IntConstOpnd::New(2,TyInt32,this->m_func,false);
  Lowerer::InsertTest(&pIVar8->super_Opnd,&pIVar7->super_Opnd,typeOfInstr);
  InsertCmovCC(CMOVNE,&indexOpnd->super_Opnd,&pRVar9->super_Opnd,typeOfInstr,false);
  bVar3 = IR::Opnd::IsEqual(this_00,(Opnd *)baseOpnd);
  if (bVar3) {
    assignInstr = IR::Instr::HoistSrc1(typeOfInstr,Ld_A,RegNOREG,(StackSym *)0x0);
    ChangeToWriteBarrierAssign(assignInstr,assignInstr->m_func);
  }
  scale = LowererMDArch::GetDefaultIndirScale();
  pIVar8 = IR::IndirOpnd::New(baseOpnd_00,indexOpnd,scale,TyUint64,func);
  Lowerer::InsertMove(this_00,&pIVar8->super_Opnd,typeOfInstr,true);
  Lowerer::InsertTestBranch(this_00,this_00,BrEq_A,target,typeOfInstr);
  Lowerer::InsertBranch(Br,target_00,typeOfInstr);
  IR::Instr::InsertBefore(typeOfInstr,&labelTarget->super_Instr);
  pIVar8 = IR::IndirOpnd::New(baseOpnd_00,0x20,TyUint64,func,false);
  Lowerer::InsertMove(this_00,&pIVar8->super_Opnd,typeOfInstr,true);
  Lowerer::InsertBranch(Br,target_00,typeOfInstr);
  IR::Instr::InsertBefore(typeOfInstr,&target->super_Instr);
  IR::Instr::InsertAfter(typeOfInstr,&target_00->super_Instr);
  Lowerer::LowerUnaryHelperMem(this->m_lowerer,typeOfInstr,HelperOp_Typeof,(Opnd *)0x0);
  return;
}

Assistant:

void
LowererMD::LowerTypeof(IR::Instr * typeOfInstr)
{
    Func * func = typeOfInstr->m_func;
    IR::Opnd * src1 = typeOfInstr->GetSrc1();
    IR::Opnd * dst = typeOfInstr->GetDst();
    Assert(src1->IsRegOpnd() && dst->IsRegOpnd());
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    IR::LabelInstr * taggedIntLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);

    // MOV typeDisplayStringsArray, &javascriptLibrary->typeDisplayStrings
    IR::RegOpnd * typeDisplayStringsArrayOpnd = IR::RegOpnd::New(TyMachPtr, func);
    m_lowerer->InsertMove(typeDisplayStringsArrayOpnd, IR::AddrOpnd::New((BYTE*)m_func->GetScriptContextInfo()->GetLibraryAddr() + Js::JavascriptLibrary::GetTypeDisplayStringsOffset(), IR::AddrOpndKindConstantAddress, this->m_func), typeOfInstr);

    GenerateObjectTest(src1, typeOfInstr, taggedIntLabel);

    // MOV typeId, TypeIds_Object
    // MOV typeRegOpnd, [src1 + offset(Type)]
    // MOV objTypeId, [typeRegOpnd + offsetof(typeId)]
    // CMP objTypeId, TypeIds_Limit                                      /*external object test*/
    // CMOVB typeId, objTypeId
    // TEST [typeRegOpnd + offsetof(flags)], TypeFlagMask_IsFalsy        /*test for falsy*/
    // CMOVNE typeId, TypeIds_Undefined
    // MOV dst, typeDisplayStrings[typeId]
    // TEST dst, dst
    // JE $helper
    // JMP $done
    IR::RegOpnd * typeIdOpnd = IR::RegOpnd::New(TyUint32, func);
    m_lowerer->InsertMove(typeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_Object, TyUint32, func), typeOfInstr);

    IR::RegOpnd * typeRegOpnd = IR::RegOpnd::New(TyMachReg, func);
    m_lowerer->InsertMove(typeRegOpnd,
        IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func),
        typeOfInstr);

    IR::RegOpnd * objTypeIdOpnd = IR::RegOpnd::New(TyUint32, func);
    m_lowerer->InsertMove(objTypeIdOpnd, IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, func), typeOfInstr);

    m_lowerer->InsertCompare(objTypeIdOpnd, IR::IntConstOpnd::New(Js::TypeIds_Limit, TyUint32, func), typeOfInstr);
    InsertCmovCC(Js::OpCode::CMOVB, typeIdOpnd, objTypeIdOpnd, typeOfInstr);

    // Insert MOV reg, 0 before the TEST because MOV reg, 0 will be peeped to XOR reg, reg and that may affect the zero flags that CMOVE depends on
    IR::RegOpnd* typeIdUndefinedOpnd = IR::RegOpnd::New(TyUint32, func);
    m_lowerer->InsertMove(typeIdUndefinedOpnd, IR::IntConstOpnd::New(Js::TypeIds_Undefined, TyUint32, func), typeOfInstr);

    IR::Opnd *flagsOpnd = IR::IndirOpnd::New(typeRegOpnd, Js::Type::GetOffsetOfFlags(), TyInt32, this->m_func);
    m_lowerer->InsertTest(flagsOpnd, IR::IntConstOpnd::New(TypeFlagMask_IsFalsy, TyInt32, this->m_func), typeOfInstr);
    InsertCmovCC(Js::OpCode::CMOVNE, typeIdOpnd, typeIdUndefinedOpnd, typeOfInstr);

    if (dst->IsEqual(src1))
    {
        ChangeToAssign(typeOfInstr->HoistSrc1(Js::OpCode::Ld_A));
    }
    m_lowerer->InsertMove(dst, IR::IndirOpnd::New(typeDisplayStringsArrayOpnd, typeIdOpnd, this->GetDefaultIndirScale(), TyMachPtr, func), typeOfInstr);
    m_lowerer->InsertTestBranch(dst, dst, Js::OpCode::BrEq_A, helperLabel, typeOfInstr);

    m_lowerer->InsertBranch(Js::OpCode::Br, doneLabel, typeOfInstr);

    // $taggedInt:
    //   MOV dst, typeDisplayStrings[TypeIds_Number]
    //   JMP $done
    typeOfInstr->InsertBefore(taggedIntLabel);
    m_lowerer->InsertMove(dst, IR::IndirOpnd::New(typeDisplayStringsArrayOpnd, Js::TypeIds_Number * sizeof(Js::Var), TyMachPtr, func), typeOfInstr);
    m_lowerer->InsertBranch(Js::OpCode::Br, doneLabel, typeOfInstr);

    // $helper
    //   CALL OP_TypeOf
    // $done
    typeOfInstr->InsertBefore(helperLabel);
    typeOfInstr->InsertAfter(doneLabel);
    m_lowerer->LowerUnaryHelperMem(typeOfInstr, IR::HelperOp_Typeof);
}